

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O0

string * __thiscall
bredis::bredis_category::message_abi_cxx11_
          (string *__return_storage_ptr__,bredis_category *this,int ev)

{
  allocator local_39;
  allocator local_38;
  allocator local_37;
  allocator local_36;
  allocator local_35 [20];
  allocator local_21;
  int local_20;
  int local_1c;
  bredis_errors ec;
  int ev_local;
  bredis_category *this_local;
  
  local_20 = ev;
  local_1c = ev;
  _ec = this;
  this_local = (bredis_category *)__return_storage_ptr__;
  switch(ev) {
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"Wrong introduction",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"Parser error",local_35);
    std::allocator<char>::~allocator((allocator<char> *)local_35);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"Cannot convert count to number",&local_36);
    std::allocator<char>::~allocator((allocator<char> *)&local_36);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"Unacceptable count value",&local_37);
    std::allocator<char>::~allocator((allocator<char> *)&local_37);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"Terminator for bulk string not found",&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_38);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"Unknown protocol error",&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string message(int ev) const {
        auto ec = static_cast<bredis_errors>(ev);
        switch (ec) {
        case bredis_errors::wrong_intoduction:
            return "Wrong introduction";
        case bredis_errors::parser_error:
            return "Parser error";
        case bredis_errors::count_conversion:
            return "Cannot convert count to number";
        case bredis_errors::count_range:
            return "Unacceptable count value";
        case bredis_errors::bulk_terminator:
            return "Terminator for bulk string not found";
        }
        return "Unknown protocol error";
    }